

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerSetJournalMode(Pager *pPager,int eMode)

{
  byte bVar1;
  u8 uVar2;
  sqlite3_file *psVar3;
  sqlite3_io_methods *psVar4;
  int iVar5;
  
  bVar1 = pPager->journalMode;
  if (((pPager->memDb != '\0') && (eMode != 2)) && (eMode != 4)) {
    eMode = (uint)bVar1;
  }
  if (eMode != (uint)bVar1) {
    pPager->journalMode = (u8)eMode;
    if ((((eMode & 1U) == 0) && ((bVar1 & 5) == 1)) && (pPager->exclusiveMode == '\0')) {
      psVar3 = pPager->jfd;
      if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
        (*psVar3->pMethods->xClose)(psVar3);
        psVar3->pMethods = (sqlite3_io_methods *)0x0;
      }
      if (pPager->eLock < 2) {
        uVar2 = pPager->eState;
        iVar5 = 0;
        if (uVar2 == '\0') {
          iVar5 = sqlite3PagerSharedLock(pPager);
        }
        if (pPager->eState == '\x01') {
          iVar5 = pagerLockDb(pPager,2);
        }
        if (iVar5 == 0) {
          (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,0);
        }
        if (uVar2 == '\x01' && iVar5 == 0) {
          psVar4 = pPager->fd->pMethods;
          if (psVar4 != (sqlite3_io_methods *)0x0) {
            if (pPager->noLock == '\0') {
              (*psVar4->xUnlock)(pPager->fd,1);
            }
            if (pPager->eLock != '\x05') {
              pPager->eLock = '\x01';
            }
          }
        }
        else if (uVar2 == '\0') {
          pager_unlock(pPager);
        }
      }
      else {
        (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,0);
      }
    }
    else if (eMode == 2) {
      psVar3 = pPager->jfd;
      if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
        (*psVar3->pMethods->xClose)(psVar3);
        psVar3->pMethods = (sqlite3_io_methods *)0x0;
      }
    }
  }
  return (int)pPager->journalMode;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSetJournalMode(Pager *pPager, int eMode){
  u8 eOld = pPager->journalMode;    /* Prior journalmode */

#ifdef SQLITE_DEBUG
  /* The print_pager_state() routine is intended to be used by the debugger
  ** only.  We invoke it once here to suppress a compiler warning. */
  print_pager_state(pPager);
#endif


  /* The eMode parameter is always valid */
  assert(      eMode==PAGER_JOURNALMODE_DELETE
            || eMode==PAGER_JOURNALMODE_TRUNCATE
            || eMode==PAGER_JOURNALMODE_PERSIST
            || eMode==PAGER_JOURNALMODE_OFF 
            || eMode==PAGER_JOURNALMODE_WAL 
            || eMode==PAGER_JOURNALMODE_MEMORY );

  /* This routine is only called from the OP_JournalMode opcode, and
  ** the logic there will never allow a temporary file to be changed
  ** to WAL mode.
  */
  assert( pPager->tempFile==0 || eMode!=PAGER_JOURNALMODE_WAL );

  /* Do allow the journalmode of an in-memory database to be set to
  ** anything other than MEMORY or OFF
  */
  if( MEMDB ){
    assert( eOld==PAGER_JOURNALMODE_MEMORY || eOld==PAGER_JOURNALMODE_OFF );
    if( eMode!=PAGER_JOURNALMODE_MEMORY && eMode!=PAGER_JOURNALMODE_OFF ){
      eMode = eOld;
    }
  }

  if( eMode!=eOld ){

    /* Change the journal mode. */
    assert( pPager->eState!=PAGER_ERROR );
    pPager->journalMode = (u8)eMode;

    /* When transistioning from TRUNCATE or PERSIST to any other journal
    ** mode except WAL, unless the pager is in locking_mode=exclusive mode,
    ** delete the journal file.
    */
    assert( (PAGER_JOURNALMODE_TRUNCATE & 5)==1 );
    assert( (PAGER_JOURNALMODE_PERSIST & 5)==1 );
    assert( (PAGER_JOURNALMODE_DELETE & 5)==0 );
    assert( (PAGER_JOURNALMODE_MEMORY & 5)==4 );
    assert( (PAGER_JOURNALMODE_OFF & 5)==0 );
    assert( (PAGER_JOURNALMODE_WAL & 5)==5 );

    assert( isOpen(pPager->fd) || pPager->exclusiveMode );
    if( !pPager->exclusiveMode && (eOld & 5)==1 && (eMode & 1)==0 ){

      /* In this case we would like to delete the journal file. If it is
      ** not possible, then that is not a problem. Deleting the journal file
      ** here is an optimization only.
      **
      ** Before deleting the journal file, obtain a RESERVED lock on the
      ** database file. This ensures that the journal file is not deleted
      ** while it is in use by some other client.
      */
      sqlite3OsClose(pPager->jfd);
      if( pPager->eLock>=RESERVED_LOCK ){
        sqlite3OsDelete(pPager->pVfs, pPager->zJournal, 0);
      }else{
        int rc = SQLITE_OK;
        int state = pPager->eState;
        assert( state==PAGER_OPEN || state==PAGER_READER );
        if( state==PAGER_OPEN ){
          rc = sqlite3PagerSharedLock(pPager);
        }
        if( pPager->eState==PAGER_READER ){
          assert( rc==SQLITE_OK );
          rc = pagerLockDb(pPager, RESERVED_LOCK);
        }
        if( rc==SQLITE_OK ){
          sqlite3OsDelete(pPager->pVfs, pPager->zJournal, 0);
        }
        if( rc==SQLITE_OK && state==PAGER_READER ){
          pagerUnlockDb(pPager, SHARED_LOCK);
        }else if( state==PAGER_OPEN ){
          pager_unlock(pPager);
        }
        assert( state==pPager->eState );
      }
    }else if( eMode==PAGER_JOURNALMODE_OFF ){
      sqlite3OsClose(pPager->jfd);
    }
  }

  /* Return the new journal mode */
  return (int)pPager->journalMode;
}